

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep4(char *aBuf,int *pnBuf)

{
  int iVar1;
  int iVar2;
  int nBuf;
  int ret;
  int *pnBuf_local;
  char *aBuf_local;
  
  iVar1 = *pnBuf;
  switch(aBuf[iVar1 + -2]) {
  case 'a':
    if (((2 < iVar1) && (iVar2 = memcmp("al",aBuf + (iVar1 + -2),2), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -2), iVar2 != 0)) {
      *pnBuf = iVar1 + -2;
    }
    break;
  case 'c':
    if ((iVar1 < 5) || (iVar2 = memcmp("ance",aBuf + (iVar1 + -4),4), iVar2 != 0)) {
      if ((4 < iVar1) &&
         ((iVar2 = memcmp("ence",aBuf + (iVar1 + -4),4), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -4), iVar2 != 0)))) {
        *pnBuf = iVar1 + -4;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -4);
      if (iVar2 != 0) {
        *pnBuf = iVar1 + -4;
      }
    }
    break;
  case 'e':
    if (((2 < iVar1) && (iVar2 = memcmp("er",aBuf + (iVar1 + -2),2), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -2), iVar2 != 0)) {
      *pnBuf = iVar1 + -2;
    }
    break;
  case 'i':
    if (((2 < iVar1) && (iVar2 = memcmp("ic",aBuf + (iVar1 + -2),2), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -2), iVar2 != 0)) {
      *pnBuf = iVar1 + -2;
    }
    break;
  case 'l':
    if ((iVar1 < 5) || (iVar2 = memcmp("able",aBuf + (iVar1 + -4),4), iVar2 != 0)) {
      if ((4 < iVar1) &&
         ((iVar2 = memcmp("ible",aBuf + (iVar1 + -4),4), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -4), iVar2 != 0)))) {
        *pnBuf = iVar1 + -4;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -4);
      if (iVar2 != 0) {
        *pnBuf = iVar1 + -4;
      }
    }
    break;
  case 'n':
    if ((iVar1 < 4) || (iVar2 = memcmp("ant",aBuf + (iVar1 + -3),3), iVar2 != 0)) {
      if ((iVar1 < 6) || (iVar2 = memcmp("ement",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
        if ((iVar1 < 5) || (iVar2 = memcmp("ment",aBuf + (iVar1 + -4),4), iVar2 != 0)) {
          if ((3 < iVar1) &&
             ((iVar2 = memcmp("ent",aBuf + (iVar1 + -3),3), iVar2 == 0 &&
              (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3), iVar2 != 0)))) {
            *pnBuf = iVar1 + -3;
          }
        }
        else {
          iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -4);
          if (iVar2 != 0) {
            *pnBuf = iVar1 + -4;
          }
        }
      }
      else {
        iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -5);
        if (iVar2 != 0) {
          *pnBuf = iVar1 + -5;
        }
      }
    }
    else {
      iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3);
      if (iVar2 != 0) {
        *pnBuf = iVar1 + -3;
      }
    }
    break;
  case 'o':
    if ((iVar1 < 4) || (iVar2 = memcmp("ion",aBuf + (iVar1 + -3),3), iVar2 != 0)) {
      if ((2 < iVar1) &&
         ((iVar2 = memcmp("ou",aBuf + (iVar1 + -2),2), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -2), iVar2 != 0)))) {
        *pnBuf = iVar1 + -2;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1_and_S_or_T(aBuf,iVar1 + -3);
      if (iVar2 != 0) {
        *pnBuf = iVar1 + -3;
      }
    }
    break;
  case 's':
    if (((3 < iVar1) && (iVar2 = memcmp("ism",aBuf + (iVar1 + -3),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3), iVar2 != 0)) {
      *pnBuf = iVar1 + -3;
    }
    break;
  case 't':
    if ((iVar1 < 4) || (iVar2 = memcmp("ate",aBuf + (iVar1 + -3),3), iVar2 != 0)) {
      if ((3 < iVar1) &&
         ((iVar2 = memcmp("iti",aBuf + (iVar1 + -3),3), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3), iVar2 != 0)))) {
        *pnBuf = iVar1 + -3;
      }
    }
    else {
      iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3);
      if (iVar2 != 0) {
        *pnBuf = iVar1 + -3;
      }
    }
    break;
  case 'u':
    if (((3 < iVar1) && (iVar2 = memcmp("ous",aBuf + (iVar1 + -3),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3), iVar2 != 0)) {
      *pnBuf = iVar1 + -3;
    }
    break;
  case 'v':
    if (((3 < iVar1) && (iVar2 = memcmp("ive",aBuf + (iVar1 + -3),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3), iVar2 != 0)) {
      *pnBuf = iVar1 + -3;
    }
    break;
  case 'z':
    if (((3 < iVar1) && (iVar2 = memcmp("ize",aBuf + (iVar1 + -3),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt1(aBuf,iVar1 + -3), iVar2 != 0)) {
      *pnBuf = iVar1 + -3;
    }
  }
  return 0;
}

Assistant:

static int fts5PorterStep4(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){
    
    case 'a': 
      if( nBuf>2 && 0==memcmp("al", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;
  
    case 'c': 
      if( nBuf>4 && 0==memcmp("ance", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }else if( nBuf>4 && 0==memcmp("ence", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }
      break;
  
    case 'e': 
      if( nBuf>2 && 0==memcmp("er", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;
  
    case 'i': 
      if( nBuf>2 && 0==memcmp("ic", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;
  
    case 'l': 
      if( nBuf>4 && 0==memcmp("able", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }else if( nBuf>4 && 0==memcmp("ible", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }
      break;
  
    case 'n': 
      if( nBuf>3 && 0==memcmp("ant", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }else if( nBuf>5 && 0==memcmp("ement", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt1(aBuf, nBuf-5) ){
          *pnBuf = nBuf - 5;
        }
      }else if( nBuf>4 && 0==memcmp("ment", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt1(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }else if( nBuf>3 && 0==memcmp("ent", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
    case 'o': 
      if( nBuf>3 && 0==memcmp("ion", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1_and_S_or_T(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }else if( nBuf>2 && 0==memcmp("ou", &aBuf[nBuf-2], 2) ){
        if( fts5Porter_MGt1(aBuf, nBuf-2) ){
          *pnBuf = nBuf - 2;
        }
      }
      break;
  
    case 's': 
      if( nBuf>3 && 0==memcmp("ism", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
    case 't': 
      if( nBuf>3 && 0==memcmp("ate", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }else if( nBuf>3 && 0==memcmp("iti", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
    case 'u': 
      if( nBuf>3 && 0==memcmp("ous", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
    case 'v': 
      if( nBuf>3 && 0==memcmp("ive", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
    case 'z': 
      if( nBuf>3 && 0==memcmp("ize", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt1(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
  }
  return ret;
}